

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O1

void __thiscall
DActiveButton::DActiveButton
          (DActiveButton *this,side_t *side,int Where,FSwitchDef *Switch,DVector2 *pos,bool useagain
          )

{
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_007017a8;
  this->m_Side = side;
  this->m_Part = (SBYTE)Where;
  (this->m_Pos).Y = pos->Y;
  (this->m_Pos).X = pos->X;
  this->bFlippable = useagain;
  this->bReturning = false;
  this->m_SwitchDef = Switch;
  this->m_Frame = -1;
  AdvanceFrame(this);
  return;
}

Assistant:

DActiveButton::DActiveButton (side_t *side, int Where, FSwitchDef *Switch,
							  const DVector2 &pos, bool useagain)
{
	m_Side = side;
	m_Part = SBYTE(Where);
	m_Pos = pos;
	bFlippable = useagain;
	bReturning = false;

	m_SwitchDef = Switch;
	m_Frame = -1;
	AdvanceFrame ();
}